

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Segment::DoLoadCluster(Segment *this,longlong *pos,long *len)

{
  long lVar1;
  int iVar2;
  longlong lVar3;
  longlong lVar4;
  ulong size_;
  Cluster *pCVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  longlong avail;
  longlong total;
  long len_;
  longlong pos_;
  long local_58;
  long local_50;
  Cues *local_48;
  long local_40;
  longlong local_38;
  
  if (this->m_pos < 0) {
    lVar10 = DoLoadClusterUnknownSize(this,pos,len);
    return lVar10;
  }
  iVar2 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&local_50,&local_58);
  if (iVar2 < 0) {
    lVar10 = (long)iVar2;
  }
  else if ((local_50 < 0) || (local_58 <= local_50)) {
    lVar10 = this->m_pos;
    lVar8 = this->m_start + this->m_size;
    if (this->m_size < 0) {
      lVar8 = -1;
    }
    if (lVar10 < local_50 || local_50 < 0) {
      do {
        if ((-1 < lVar8) && (lVar8 <= lVar10)) break;
        *pos = lVar10;
        if (local_58 <= lVar10) {
          *len = 1;
          return -3;
        }
        lVar3 = GetUIntLength(this->m_pReader,lVar10,len);
        if (lVar3 < 0) {
          return lVar3;
        }
        if (lVar3 != 0) {
          return -3;
        }
        lVar6 = *pos;
        if (-1 < lVar8 && lVar8 < *len + lVar6) goto LAB_0015ac2a;
        if (local_58 < *len + lVar6) {
          return -3;
        }
        lVar3 = ReadID(this->m_pReader,lVar6,len);
        if (lVar3 < 0) goto LAB_0015ac2a;
        lVar10 = *pos + *len;
        *pos = lVar10;
        if (local_58 <= lVar10) {
          *len = 1;
          return -3;
        }
        lVar4 = GetUIntLength(this->m_pReader,lVar10,len);
        if (lVar4 < 0) {
          return lVar4;
        }
        if (lVar4 != 0) {
          return -3;
        }
        lVar10 = *len + *pos;
        if (-1 < lVar8 && lVar8 < lVar10) goto LAB_0015ac2a;
        if (local_58 < lVar10) {
          return -3;
        }
        size_ = ReadUInt(this->m_pReader,*pos,len);
        if ((long)size_ < 0) {
          return size_;
        }
        lVar1 = *len;
        lVar11 = *pos + lVar1;
        *pos = lVar11;
        lVar10 = lVar11;
        if (size_ != 0) {
          uVar7 = -1L << ((char)lVar1 * '\a' & 0x3fU) ^ size_;
          lVar10 = lVar11 + size_;
          if (((-1 < lVar8) && (uVar7 != 0xffffffffffffffff)) && (lVar8 < lVar10))
          goto LAB_0015ac2a;
          if (lVar3 == 0x1c53bb6b) {
            if (uVar7 == 0xffffffffffffffff) goto LAB_0015ac2a;
            if (this->m_pCues == (Cues *)0x0) {
              local_48 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
              if (local_48 == (Cues *)0x0) {
                this->m_pCues = (Cues *)0x0;
                return -1;
              }
              Cues::Cues(local_48,this,lVar11,size_,lVar6,(size_ - lVar6) + lVar11);
              this->m_pCues = local_48;
              lVar10 = *pos + size_;
            }
          }
          else {
            if (lVar3 == 0x1f43b675) {
              if (uVar7 == 0xffffffffffffffff) {
                size_ = 0xffffffffffffffff;
              }
              lVar6 = lVar6 - this->m_start;
              if (lVar6 < 0) {
                return -2;
              }
              lVar10 = Cluster::HasBlockEntries(this,lVar6,&local_38,&local_40);
              if (lVar10 < 0) {
                *pos = local_38;
                *len = local_40;
                return lVar10;
              }
              lVar1 = this->m_clusterCount;
              lVar11 = this->m_clusterPreloadCount;
              if (0 < lVar11) {
                if (this->m_clusterSize <= lVar1) {
                  return -2;
                }
                pCVar5 = this->m_clusters[lVar1];
                if (pCVar5 == (Cluster *)0x0) {
                  return -2;
                }
                if (-1 < pCVar5->m_index) {
                  return -2;
                }
                lVar9 = pCVar5->m_element_start - pCVar5->m_pSegment->m_start;
                if (lVar9 < 0) {
                  return -2;
                }
                if (lVar9 == lVar6) {
                  if (lVar10 == 0) {
                    return -2;
                  }
                  if ((long)size_ < 0) {
                    if (pCVar5->m_element_size < 1) {
                      return -2;
                    }
                    lVar10 = pCVar5->m_element_size + pCVar5->m_element_start;
                  }
                  else {
                    lVar10 = size_ + *pos;
                  }
                  bVar12 = lVar8 < 0;
                  *pos = lVar10;
                  pCVar5->m_index = lVar1;
                  this->m_clusterCount = lVar1 + 1;
                  this->m_clusterPreloadCount = lVar11 + -1;
                  this->m_pos = lVar10;
                  goto LAB_0015b078;
                }
              }
              if (lVar10 != 0) {
                pCVar5 = Cluster::Create(this,lVar1,lVar6);
                if (pCVar5 == (Cluster *)0x0) {
                  return -1;
                }
                bVar12 = AppendCluster(this,pCVar5);
                if (!bVar12) {
                  Cluster::~Cluster(pCVar5);
                  operator_delete(pCVar5);
                  return -1;
                }
                if ((long)size_ < 0) {
                  this->m_pUnknownSize = pCVar5;
                  this->m_pos = -*pos;
                  return 0;
                }
                lVar10 = size_ + *pos;
                *pos = lVar10;
                this->m_pos = lVar10;
                bVar12 = lVar8 < 1;
LAB_0015b078:
                return (ulong)(byte)(lVar10 <= lVar8 | bVar12) * 2 + -2;
              }
              lVar10 = *pos;
              if (-1 < (long)size_) {
                lVar10 = lVar10 + size_;
                *pos = lVar10;
              }
              if ((local_50 < 0) || (lVar10 < local_50)) {
                if ((lVar8 < 0) || (lVar10 < lVar8)) {
                  this->m_pos = lVar10;
                  return 2;
                }
                this->m_pos = lVar8;
              }
              else {
                this->m_pos = local_50;
              }
              break;
            }
            if (uVar7 == 0xffffffffffffffff) goto LAB_0015ac2a;
          }
        }
        this->m_pos = lVar10;
      } while ((local_50 < 0) || (lVar10 < local_50));
    }
    lVar10 = 1;
  }
  else {
LAB_0015ac2a:
    lVar10 = -2;
  }
  return lVar10;
}

Assistant:

long Segment::DoLoadCluster(long long& pos, long& len) {
  if (m_pos < 0)
    return DoLoadClusterUnknownSize(pos, len);

  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  if (total >= 0 && avail > total)
    return E_FILE_FORMAT_INVALID;

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  long long cluster_off = -1;  // offset relative to start of segment
  long long cluster_size = -1;  // size of cluster payload

  for (;;) {
    if ((total >= 0) && (m_pos >= total))
      return 1;  // no more clusters

    if ((segment_stop >= 0) && (m_pos >= segment_stop))
      return 1;  // no more clusters

    pos = m_pos;

    // Read ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long idpos = pos;
    const long long id = ReadID(m_pReader, idpos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume length of size of element

    // pos now points to start of payload

    if (size == 0) {
      // Missing element payload: move on.
      m_pos = pos;
      continue;
    }

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if ((segment_stop >= 0) && (size != unknown_size) &&
        ((pos + size) > segment_stop)) {
      return E_FILE_FORMAT_INVALID;
    }

    if (id == libwebm::kMkvCues) {
      if (size == unknown_size) {
        // Cues element of unknown size: Not supported.
        return E_FILE_FORMAT_INVALID;
      }

      if (m_pCues == NULL) {
        const long long element_size = (pos - idpos) + size;

        m_pCues = new (std::nothrow) Cues(this, pos, size, idpos, element_size);
        if (m_pCues == NULL)
          return -1;
      }

      m_pos = pos + size;  // consume payload
      continue;
    }

    if (id != libwebm::kMkvCluster) {
      // Besides the Segment, Libwebm allows only cluster elements of unknown
      // size. Fail the parse upon encountering a non-cluster element reporting
      // unknown size.
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      m_pos = pos + size;  // consume payload
      continue;
    }

    // We have a cluster.

    cluster_off = idpos - m_start;  // relative pos

    if (size != unknown_size)
      cluster_size = size;

    break;
  }

  if (cluster_off < 0) {
    // No cluster, die.
    return E_FILE_FORMAT_INVALID;
  }

  long long pos_;
  long len_;

  status = Cluster::HasBlockEntries(this, cluster_off, pos_, len_);

  if (status < 0) {  // error, or underflow
    pos = pos_;
    len = len_;

    return status;
  }

  // status == 0 means "no block entries found"
  // status > 0 means "found at least one block entry"

  // TODO:
  // The issue here is that the segment increments its own
  // pos ptr past the most recent cluster parsed, and then
  // starts from there to parse the next cluster.  If we
  // don't know the size of the current cluster, then we
  // must either parse its payload (as we do below), looking
  // for the cluster (or cues) ID to terminate the parse.
  // This isn't really what we want: rather, we really need
  // a way to create the curr cluster object immediately.
  // The pity is that cluster::parse can determine its own
  // boundary, and we largely duplicate that same logic here.
  //
  // Maybe we need to get rid of our look-ahead preloading
  // in source::parse???
  //
  // As we're parsing the blocks in the curr cluster
  //(in cluster::parse), we should have some way to signal
  // to the segment that we have determined the boundary,
  // so it can adjust its own segment::m_pos member.
  //
  // The problem is that we're asserting in asyncreadinit,
  // because we adjust the pos down to the curr seek pos,
  // and the resulting adjusted len is > 2GB.  I'm suspicious
  // that this is even correct, but even if it is, we can't
  // be loading that much data in the cache anyway.

  const long idx = m_clusterCount;

  if (m_clusterPreloadCount > 0) {
    if (idx >= m_clusterSize)
      return E_FILE_FORMAT_INVALID;

    Cluster* const pCluster = m_clusters[idx];
    if (pCluster == NULL || pCluster->m_index >= 0)
      return E_FILE_FORMAT_INVALID;

    const long long off = pCluster->GetPosition();
    if (off < 0)
      return E_FILE_FORMAT_INVALID;

    if (off == cluster_off) {  // preloaded already
      if (status == 0)  // no entries found
        return E_FILE_FORMAT_INVALID;

      if (cluster_size >= 0)
        pos += cluster_size;
      else {
        const long long element_size = pCluster->GetElementSize();

        if (element_size <= 0)
          return E_FILE_FORMAT_INVALID;  // TODO: handle this case

        pos = pCluster->m_element_start + element_size;
      }

      pCluster->m_index = idx;  // move from preloaded to loaded
      ++m_clusterCount;
      --m_clusterPreloadCount;

      m_pos = pos;  // consume payload
      if (segment_stop >= 0 && m_pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      return 0;  // success
    }
  }

  if (status == 0) {  // no entries found
    if (cluster_size >= 0)
      pos += cluster_size;

    if ((total >= 0) && (pos >= total)) {
      m_pos = total;
      return 1;  // no more clusters
    }

    if ((segment_stop >= 0) && (pos >= segment_stop)) {
      m_pos = segment_stop;
      return 1;  // no more clusters
    }

    m_pos = pos;
    return 2;  // try again
  }

  // status > 0 means we have an entry

  Cluster* const pCluster = Cluster::Create(this, idx, cluster_off);
  if (pCluster == NULL)
    return -1;

  if (!AppendCluster(pCluster)) {
    delete pCluster;
    return -1;
  }

  if (cluster_size >= 0) {
    pos += cluster_size;

    m_pos = pos;

    if (segment_stop > 0 && m_pos > segment_stop)
      return E_FILE_FORMAT_INVALID;

    return 0;
  }

  m_pUnknownSize = pCluster;
  m_pos = -pos;

  return 0;  // partial success, since we have a new cluster

  // status == 0 means "no block entries found"
  // pos designates start of payload
  // m_pos has NOT been adjusted yet (in case we need to come back here)
}